

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::submitBufferWaitManySemaphores
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::Handle<(vk::HandleType)10>_> data_01;
  RefData<vk::Handle<(vk::HandleType)6>_> data_02;
  RefData<vk::Handle<(vk::HandleType)4>_> data_03;
  VkResult VVar2;
  VkDevice device;
  DeviceInterface *vk_00;
  VkQueue pVVar3;
  Handle<(vk::HandleType)10> *pHVar4;
  VkCommandBuffer_s **ppVVar5;
  Handle<(vk::HandleType)4> *pHVar6;
  Handle<(vk::HandleType)6> *pHVar7;
  VkAllocationCallbacks **local_758;
  Handle<(vk::HandleType)4> *local_620;
  Move<vk::Handle<(vk::HandleType)4>_> *local_600;
  allocator<char> local_591;
  string local_590;
  deUint64 local_570;
  allocator<char> local_561;
  string local_560;
  deUint64 local_540;
  int local_534;
  deUint64 dStack_530;
  VkResult result_1;
  undefined4 local_528 [2];
  VkSubmitInfo submitInfo2;
  allocator<unsigned_int> local_4d5;
  deUint32 idxSubmission;
  undefined1 local_4d0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> waitDstStageFlags;
  deUint32 numberOfSemaphoresToBeWaitedByOneSubmission;
  allocator<char> local_4a1;
  string local_4a0;
  deUint64 local_480;
  int local_474;
  deUint64 dStack_470;
  VkResult result;
  undefined4 local_468 [2];
  VkSubmitInfo submitInfo1;
  RefData<vk::Handle<(vk::HandleType)4>_> local_400;
  uint local_3dc;
  deUint32 idx;
  VkSemaphore semaphores [10];
  Move<vk::Handle<(vk::HandleType)4>_> semaphoreArray [10];
  Move<vk::Handle<(vk::HandleType)6>_> local_240;
  RefData<vk::Handle<(vk::HandleType)6>_> local_220;
  undefined1 local_200 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  VkPipelineStageFlags stageMask;
  Move<vk::Handle<(vk::HandleType)10>_> local_1c8;
  RefData<vk::Handle<(vk::HandleType)10>_> local_1a8;
  undefined1 local_188 [8];
  Unique<vk::Handle<(vk::HandleType)10>_> event;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  RefData<vk::VkCommandBuffer_s_*> local_128;
  undefined1 local_108 [8];
  Unique<vk::VkCommandBuffer_s_*> primCmdBuf;
  VkCommandBufferAllocateInfo cmdBufParams;
  Move<vk::Handle<(vk::HandleType)24>_> local_b8;
  RefData<vk::Handle<(vk::HandleType)24>_> local_98;
  undefined1 local_78 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandPoolCreateInfo cmdPoolParams;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  DeviceInterface *vk;
  VkDevice vkDevice;
  deUint32 numSubmissions;
  deUint32 numSemaphores;
  Context *context_local;
  
  device = Context::getDevice(context);
  vk_00 = Context::getDeviceInterface(context);
  pVVar3 = Context::getUniversalQueue(context);
  Context::getUniversalQueueFamilyIndex(context);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ = 0x27;
  ::vk::createCommandPool
            (&local_b8,vk_00,device,
             (VkCommandPoolCreateInfo *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_98,(Move *)&local_b8);
  data.deleter.m_deviceIface = local_98.deleter.m_deviceIface;
  data.object.m_internal = local_98.object.m_internal;
  data.deleter.m_device = local_98.deleter.m_device;
  data.deleter.m_allocator = local_98.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_78,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_b8);
  primCmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._0_4_ = 0x28;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_78);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&primCmdBufBeginInfo.pInheritanceInfo,vk_00,device,
             (VkCommandBufferAllocateInfo *)
             &primCmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_128,(Move *)&primCmdBufBeginInfo.pInheritanceInfo);
  data_00.deleter.m_deviceIface = local_128.deleter.m_deviceIface;
  data_00.object = local_128.object;
  data_00.deleter.m_device = local_128.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_128.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_108,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
            ((Move<vk::VkCommandBuffer_s_*> *)&primCmdBufBeginInfo.pInheritanceInfo);
  primCmdBufBeginInfo.pNext = (void *)0x0;
  primCmdBufBeginInfo.flags = 0;
  primCmdBufBeginInfo._20_4_ = 0;
  event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x2a;
  primCmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  primCmdBufBeginInfo._4_4_ = 0;
  ::vk::createEvent(&local_1c8,vk_00,device,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1a8,(Move *)&local_1c8);
  data_01.deleter.m_deviceIface = local_1a8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1a8.object.m_internal;
  data_01.deleter.m_device = local_1a8.deleter.m_device;
  data_01.deleter.m_allocator = local_1a8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_188,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move(&local_1c8);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_188);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x1d])(vk_00,device,pHVar4->m_internal);
  ::vk::checkResult(VVar2,"vk.resetEvent(vkDevice, *event)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd6c);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_108);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x49])
                    (vk_00,*ppVVar5,
                     &event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                      m_allocator);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd6f);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_108);
  pVVar1 = *ppVVar5;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_188);
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar4->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x6a])
            (vk_00,pVVar1,
             fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator,0x10000)
  ;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_108);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar5);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd77);
  ::vk::createFence(&local_240,vk_00,device,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_220,(Move *)&local_240);
  data_02.deleter.m_deviceIface = local_220.deleter.m_deviceIface;
  data_02.object.m_internal = local_220.object.m_internal;
  data_02.deleter.m_device = local_220.deleter.m_device;
  data_02.deleter.m_allocator = local_220.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_200,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_240);
  local_600 = (Move<vk::Handle<(vk::HandleType)4>_> *)(semaphores + 9);
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::Move(local_600);
    local_600 = local_600 + 1;
  } while (local_600 !=
           (Move<vk::Handle<(vk::HandleType)4>_> *)
           &semaphoreArray[9].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
            m_allocator);
  local_620 = (Handle<(vk::HandleType)4> *)&stack0xfffffffffffffc28;
  do {
    ::vk::Handle<(vk::HandleType)4>::Handle(local_620);
    local_620 = local_620 + 1;
  } while (local_620 != semaphores + 9);
  for (local_3dc = 0; local_3dc < 10; local_3dc = local_3dc + 1) {
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)&submitInfo1.pSignalSemaphores,vk_00,device,0
               ,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_400,(Move *)&submitInfo1.pSignalSemaphores);
    data_03.deleter.m_deviceIface = local_400.deleter.m_deviceIface;
    data_03.object.m_internal = local_400.object.m_internal;
    data_03.deleter.m_device = local_400.deleter.m_device;
    data_03.deleter.m_allocator = local_400.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::operator=
              ((Move<vk::Handle<(vk::HandleType)4>_> *)
               &semaphoreArray[(ulong)local_3dc - 1].super_RefBase<vk::Handle<(vk::HandleType)4>_>.
                m_data.deleter.m_allocator,data_03);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)4>_> *)&submitInfo1.pSignalSemaphores);
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                       ((RefBase<vk::Handle<(vk::HandleType)4>_> *)
                        &semaphoreArray[(ulong)local_3dc - 1].
                         super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator);
    *(deUint64 *)(&stack0xfffffffffffffc28 + (ulong)local_3dc * 8) = pHVar6->m_internal;
  }
  local_468[0] = 4;
  submitInfo1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo1._4_4_ = 0;
  submitInfo1.pNext._0_4_ = 0;
  submitInfo1.waitSemaphoreCount = 0;
  submitInfo1._20_4_ = 0;
  submitInfo1.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo1.pWaitDstStageMask._0_4_ = 1;
  submitInfo1._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_108);
  submitInfo1.pCommandBuffers._0_4_ = 10;
  submitInfo1._56_8_ = &stack0xfffffffffffffc28;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_200);
  dStack_470 = pHVar7->m_internal;
  VVar2 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar3,1,local_468,dStack_470);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo1, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd96);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_200);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device,1,pHVar7,0,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0xd99);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_188);
  local_480 = pHVar4->m_internal;
  local_474 = (*vk_00->_vptr_DeviceInterface[0x1b])(vk_00,device,local_480);
  if (local_474 == 3) {
    pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_188);
    VVar2 = (*vk_00->_vptr_DeviceInterface[0x1d])(vk_00,device,pHVar4->m_internal);
    ::vk::checkResult(VVar2,"vk.resetEvent(vkDevice, *event)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xda1);
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                       ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_200);
    VVar2 = (*vk_00->_vptr_DeviceInterface[0x14])(vk_00,device,1,pHVar7);
    ::vk::checkResult(VVar2,"vk.resetFences(vkDevice, 1u, &fence.get())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0xda4);
    waitDstStageFlags.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
    idxSubmission = 1;
    std::allocator<unsigned_int>::allocator(&local_4d5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4d0,5,&idxSubmission,
               &local_4d5);
    std::allocator<unsigned_int>::~allocator(&local_4d5);
    for (submitInfo2.pSignalSemaphores._4_4_ = 0; submitInfo2.pSignalSemaphores._4_4_ < 2;
        submitInfo2.pSignalSemaphores._4_4_ = submitInfo2.pSignalSemaphores._4_4_ + 1) {
      local_528[0] = 4;
      submitInfo2.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      submitInfo2._4_4_ = 0;
      submitInfo2.pNext._0_4_ = 5;
      submitInfo2._16_8_ =
           &stack0xfffffffffffffc28 + (ulong)(submitInfo2.pSignalSemaphores._4_4_ * 5) * 8;
      submitInfo2.pWaitSemaphores =
           (VkSemaphore *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4d0);
      submitInfo2.pWaitDstStageMask._0_4_ = 1;
      submitInfo2._40_8_ =
           ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                     ((RefBase<vk::VkCommandBuffer_s_*> *)local_108);
      submitInfo2.pCommandBuffers._0_4_ = 0;
      submitInfo2.signalSemaphoreCount = 0;
      submitInfo2._60_4_ = 0;
      pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_200);
      dStack_530 = pHVar7->m_internal;
      VVar2 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar3,1,local_528,dStack_530);
      ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo2, *fence)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdbc);
      pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                         ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_200);
      VVar2 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device,1,pHVar7,0,1000000000);
      ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, 1000 * 1000 * 1000)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdbf);
      pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_188);
      local_540 = pHVar4->m_internal;
      local_534 = (*vk_00->_vptr_DeviceInterface[0x1b])(vk_00,device,local_540);
      if (local_534 != 3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_560,"Submit Buffer and Wait for Many Semaphores Test FAILED",
                   &local_561);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_560);
        std::__cxx11::string::~string((string *)&local_560);
        std::allocator<char>::~allocator(&local_561);
        goto LAB_008570b0;
      }
      pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                         ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_200);
      VVar2 = (*vk_00->_vptr_DeviceInterface[0x14])(vk_00,device,1,pHVar7);
      ::vk::checkResult(VVar2,"vk.resetFences(vkDevice, 1u, &fence.get())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdc8);
      pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_188);
      local_570 = pHVar4->m_internal;
      VVar2 = (*vk_00->_vptr_DeviceInterface[0x1d])(vk_00,device,local_570);
      ::vk::checkResult(VVar2,"vk.resetEvent(vkDevice, *event)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                        ,0xdcb);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_590,"Submit Buffer and Wait for Many Semaphores Test succeeded",
               &local_591);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_590);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator(&local_591);
LAB_008570b0:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4d0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,"Submit Buffer and Wait for Many Semaphores Test FAILED",
               &local_4a1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
  }
  local_758 = &semaphoreArray[9].super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
               m_allocator;
  do {
    local_758 = local_758 + -4;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)4>_> *)local_758);
  } while ((VkSemaphore *)local_758 != semaphores + 9);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_200);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_188);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_108);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus submitBufferWaitManySemaphores(Context& context)
{
	// This test will create numSemaphores semaphores, and signal them in NUM_SEMAPHORES submits to queue
	// After that the numSubmissions queue submissions will wait for each semaphore

	const deUint32							numSemaphores			= 10u;  // it must be multiply of numSubmission
	const deUint32							numSubmissions			= 2u;
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// VkStructureType				sType;
		DE_NULL,													// const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// VkCommandPoolCreateFlags		flags;
		queueFamilyIndex,											// deUint32						queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				// VkStructureType				sType;
		DE_NULL,													// const void*					pNext;
		*cmdPool,													// VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							// VkCommandBufferLevel			level;
		1u,															// uint32_t						bufferCount;
	};

	// Create command buffer
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));

	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,				// sType
		DE_NULL,													// pNext
		0,															// flags
		DE_NULL														// const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
	};

	// create event that will be used to check if command buffers has been executed
	const Unique<VkEvent>					event					(createEvent(vk, vkDevice));

	// reset event - at creation state is undefined
	VK_CHECK(vk.resetEvent(vkDevice, *event));

	// record command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// allow execution of event during every stage of pipeline
		VkPipelineStageFlags stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;

		// record setting event
		vk.cmdSetEvent(*primCmdBuf, *event,stageMask);
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	// create fence to wait for execution of queue
	const Unique<VkFence>					fence					(createFence(vk, vkDevice));

	// numSemaphores is declared const, so this array can be static
	// the semaphores will be destroyed automatically at end of scope
	Move <VkSemaphore>						semaphoreArray[numSemaphores];
	VkSemaphore								semaphores[numSemaphores];

	for (deUint32 idx = 0; idx < numSemaphores; ++idx) {
		// create semaphores for use in this test
		semaphoreArray[idx] = createSemaphore(vk, vkDevice);
		semaphores[idx] = semaphoreArray[idx].get();
	};

	{
		// create submit info for buffer - signal semaphores
		const VkSubmitInfo submitInfo1 =
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,							// sType
			DE_NULL,												// pNext
			0u,														// waitSemaphoreCount
			DE_NULL,												// pWaitSemaphores
			DE_NULL,												// pWaitDstStageMask
			1,														// commandBufferCount
			&primCmdBuf.get(),										// pCommandBuffers
			numSemaphores,											// signalSemaphoreCount
			semaphores												// pSignalSemaphores
		};
		// Submit the command buffer to the queue
		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo1, *fence));

		// wait for end of execution of queue
		VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT));

		// check if buffer has been executed
		VkResult result = vk.getEventStatus(vkDevice,*event);
		if (result != VK_EVENT_SET)
			return tcu::TestStatus::fail("Submit Buffer and Wait for Many Semaphores Test FAILED");

		// reset event, so next buffers can set it again
		VK_CHECK(vk.resetEvent(vkDevice, *event));

		// reset fence, so it can be used again
		VK_CHECK(vk.resetFences(vkDevice, 1u, &fence.get()));
	}

	const deUint32							numberOfSemaphoresToBeWaitedByOneSubmission	= numSemaphores / numSubmissions;
	const std::vector<VkPipelineStageFlags>	waitDstStageFlags							(numberOfSemaphoresToBeWaitedByOneSubmission, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);

	// the following code waits for the semaphores set above - numSubmissions queues will wait for each semaphore from above
	for (deUint32 idxSubmission = 0; idxSubmission < numSubmissions; ++idxSubmission) {

		// create submit info for buffer - waiting for semaphore
		const VkSubmitInfo				submitInfo2				=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,												// sType
			DE_NULL,																	// pNext
			numberOfSemaphoresToBeWaitedByOneSubmission,								// waitSemaphoreCount
			semaphores + (numberOfSemaphoresToBeWaitedByOneSubmission * idxSubmission),	// pWaitSemaphores
			waitDstStageFlags.data(),													// pWaitDstStageMask
			1,																			// commandBufferCount
			&primCmdBuf.get(),															// pCommandBuffers
			0u,																			// signalSemaphoreCount
			DE_NULL,																	// pSignalSemaphores
		};

		// Submit the second command buffer to the queue
		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo2, *fence));

		// wait for 1 second.
		VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, 1000 * 1000 * 1000));

		// check if second buffer has been executed
		// if it has been executed, it means that the semaphore was signalled - so test if passed
		VkResult result = vk.getEventStatus(vkDevice,*event);
		if (result != VK_EVENT_SET)
			return tcu::TestStatus::fail("Submit Buffer and Wait for Many Semaphores Test FAILED");

		// reset fence, so it can be used again
		VK_CHECK(vk.resetFences(vkDevice, 1u, &fence.get()));

		// reset event, so next buffers can set it again
		VK_CHECK(vk.resetEvent(vkDevice, *event));
	}

	return tcu::TestStatus::pass("Submit Buffer and Wait for Many Semaphores Test succeeded");
}